

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_types.hpp
# Opt level: O2

bool operator!=(this_t *lhs,this_t *rhs)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&bStack_58,(string *)lhs);
  std::__cxx11::string::string((string *)&local_38,(string *)rhs);
  bVar1 = std::operator!=(&bStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  return bVar1;
}

Assistant:

bool operator!=(const this_t & lhs, const this_t & rhs) {
        return static_cast<rep_t>(lhs) != static_cast<rep_t>(rhs);
    }